

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O3

void __thiscall
LinkageUntangler::select_linear_anchors
          (LinkageUntangler *this,int min_links,int min_transitive_links)

{
  ulong *puVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint32_t uVar5;
  SequenceDistanceGraph *pSVar6;
  pointer pNVar7;
  DistanceGraph *this_00;
  ulong uVar8;
  long lVar9;
  difference_type __n;
  ulong n;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> fw_sorted;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> bw_sorted;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_60;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_48;
  
  this_00 = *(DistanceGraph **)this;
  pSVar6 = this_00->sdg;
  pNVar7 = (pSVar6->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(pSVar6->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar7 >> 3) * 0x6db6db6db6db6db7
                 )) {
    n = 1;
    do {
      if (pNVar7[n].status != Deleted) {
        DistanceGraph::fw_neighbours_by_distance(&local_60,this_00,n,min_links);
        if ((ulong)((long)local_60.
                          super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_60.
                         super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
LAB_001b66f7:
          DistanceGraph::fw_neighbours_by_distance(&local_48,*(DistanceGraph **)this,-n,min_links);
          bVar4 = 1;
          if (0x10 < (ulong)((long)local_48.
                                   super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48.
                                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            uVar8 = 0xffffffffffffffff;
            lVar9 = 0x18;
            do {
              uVar8 = uVar8 + 1;
              if (((long)local_48.
                         super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48.
                         super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= uVar8)
              goto LAB_001b677e;
              uVar5 = DistanceGraph::link_count
                                (*(DistanceGraph **)this,
                                 -*(long *)((long)&local_48.
                                                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  first + lVar9),
                                 *(sgNodeID_t *)
                                  ((long)&(local_48.
                                           super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first + lVar9
                                  ));
              lVar9 = lVar9 + 0x10;
            } while ((uint)min_transitive_links <= uVar5);
            bVar4 = 0;
          }
LAB_001b677e:
          bVar2 = local_60.
                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_60.
                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
          bVar3 = local_48.
                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_48.
                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
          if (local_48.
              super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((bool)(bVar4 & (bVar2 || bVar3))) {
            puVar1 = (ulong *)(*(long *)(this + 8) + (n >> 6) * 8);
            *puVar1 = *puVar1 | 1L << ((byte)n & 0x3f);
          }
        }
        else {
          uVar8 = 0xffffffffffffffff;
          lVar9 = 0x18;
          do {
            uVar8 = uVar8 + 1;
            if (((long)local_60.
                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_60.
                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= uVar8)
            goto LAB_001b66f7;
            uVar5 = DistanceGraph::link_count
                              (*(DistanceGraph **)this,
                               -*(long *)((long)&local_60.
                                                 super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].first
                                         + lVar9),
                               *(sgNodeID_t *)
                                ((long)&(local_60.
                                         super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar9))
            ;
            lVar9 = lVar9 + 0x10;
          } while ((uint)min_transitive_links <= uVar5);
        }
        if (local_60.
            super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.
                          super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        this_00 = *(DistanceGraph **)this;
        pSVar6 = this_00->sdg;
      }
      n = n + 1;
      pNVar7 = (pSVar6->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = ((long)(pSVar6->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar7 >> 3) * 0x6db6db6db6db6db7;
    } while (n <= uVar8 && uVar8 - n != 0);
  }
  return;
}

Assistant:

void LinkageUntangler::select_linear_anchors(int min_links, int min_transitive_links) {
    for (auto n=1;n<dg.sdg.nodes.size();++n){
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted) continue;
        bool anchor=true;
        auto fw_sorted=dg.fw_neighbours_by_distance(n,min_links);
        if (fw_sorted.size()>1) {
            for (auto i = 0; i < fw_sorted.size() - 1; ++i) {
                if (dg.link_count(-fw_sorted[i].second, fw_sorted[i + 1].second) < min_transitive_links) {
                    anchor = false;
                    break;
                }
            }
        }
        if (anchor) {
            auto bw_sorted = dg.fw_neighbours_by_distance(-n, min_links);
            if (bw_sorted.size()>1) {
                for (auto i = 0; i < bw_sorted.size() - 1; ++i) {
                    if (dg.link_count(-bw_sorted[i].second, bw_sorted[i + 1].second) < min_transitive_links) {
                        anchor = false;
                        break;
                    }
                }
            }
            if (bw_sorted.empty() and fw_sorted.empty()) anchor=false;
        }
        if (anchor) {
                selected_nodes[n] = true;
        }
    }
}